

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

void __thiscall
rlottie::internal::model::Property<rlottie::internal::model::PathData,_void>::Property
          (Property<rlottie::internal::model::PathData,_void> *this)

{
  Property<rlottie::internal::model::PathData,_void> *in_RDI;
  PathData *member;
  PathData local_28;
  
  details::details((details *)in_RDI);
  in_RDI->isValue_ = true;
  member = &local_28;
  memset(member,0,0x18);
  std::vector<VPointF,_std::allocator<VPointF>_>::vector
            ((vector<VPointF,_std::allocator<VPointF>_> *)0x1983af);
  local_28.mClosed = false;
  construct<rlottie::internal::model::PathData>(in_RDI,member,(PathData *)0x1983c6);
  PathData::~PathData((PathData *)0x1983d0);
  return;
}

Assistant:

Property() { construct(impl_.value_, {}); }